

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void run_timers(void)

{
  char *pcVar1;
  uint uVar2;
  timer_element *__ptr;
  
  __ptr = level->lev_timers;
  while( true ) {
    if (__ptr == (timer_element *)0x0) {
      return;
    }
    uVar2 = __ptr->timeout;
    if (moves < uVar2) break;
    level->lev_timers = __ptr->next;
    if (__ptr->kind == 2) {
      pcVar1 = (char *)((long)__ptr->arg + 0x49);
      *pcVar1 = *pcVar1 + -1;
    }
    (*timeout_funcs[__ptr->func_index].f)(__ptr->arg,(ulong)uVar2);
    free(__ptr);
    __ptr = level->lev_timers;
  }
  return;
}

Assistant:

void run_timers(void)
{
    timer_element *curr;

    /*
     * Always use the first element.  Elements may be added or deleted at
     * any time.  The list is ordered, we are done when the first element
     * is in the future.
     */
    while (level->lev_timers && level->lev_timers->timeout <= moves) {
	curr = level->lev_timers;
	level->lev_timers = curr->next;

	if (curr->kind == TIMER_OBJECT) ((struct obj *)(curr->arg))->timed--;
	(*timeout_funcs[curr->func_index].f)(curr->arg, curr->timeout);
	free(curr);
    }
}